

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FieldDescriptor::DefaultValueAsString_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,bool quote_string_type)

{
  CppType CVar1;
  Type TVar2;
  LogMessage *pLVar3;
  EnumValueDescriptor *pEVar4;
  unsigned_long i;
  char *pcVar5;
  string *src;
  LogMessage LStack_78;
  string local_40;
  
  pLVar3 = (LogMessage *)this;
  if (this[0x98] == (FieldDescriptor)0x0) {
    internal::LogMessage::LogMessage
              (&LStack_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x729);
    pLVar3 = internal::LogMessage::operator<<(&LStack_78,"CHECK failed: has_default_value(): ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,"No default value");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
    internal::LogMessage::~LogMessage(&LStack_78);
  }
  CVar1 = cpp_type(this);
  switch(CVar1) {
  case CPPTYPE_INT32:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    break;
  case CPPTYPE_INT64:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,*(protobuf **)(this + 0xa0),i);
    break;
  case CPPTYPE_UINT32:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)(ulong)*(uint *)(this + 0xa0),(uint)i);
    break;
  case CPPTYPE_UINT64:
    SimpleItoa_abi_cxx11_(__return_storage_ptr__,*(protobuf **)(this + 0xa0),i);
    break;
  case CPPTYPE_DOUBLE:
    SimpleDtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar3,*(double *)(this + 0xa0));
    break;
  case CPPTYPE_FLOAT:
    SimpleFtoa_abi_cxx11_(__return_storage_ptr__,(protobuf *)pLVar3,*(float *)(this + 0xa0));
    break;
  case CPPTYPE_BOOL:
    pcVar5 = "false";
    if (this[0xa0] != (FieldDescriptor)0x0) {
      pcVar5 = "true";
    }
    goto LAB_002dddd3;
  case CPPTYPE_ENUM:
    pEVar4 = default_value_enum(this);
    src = *(string **)pEVar4;
    goto LAB_002ddd8b;
  case CPPTYPE_STRING:
    if (quote_string_type) {
      CEscape(&local_40,*(string **)(this + 0xa0));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&LStack_78
                     ,"\"",&local_40);
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&LStack_78
                     ,"\"");
      std::__cxx11::string::~string((string *)&LStack_78);
      std::__cxx11::string::~string((string *)&local_40);
      return __return_storage_ptr__;
    }
    TVar2 = type(this);
    src = *(string **)(this + 0xa0);
    if (TVar2 == TYPE_BYTES) {
      CEscape(__return_storage_ptr__,src);
      return __return_storage_ptr__;
    }
LAB_002ddd8b:
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
    break;
  case CPPTYPE_MESSAGE:
    internal::LogMessage::LogMessage
              (&LStack_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x74f);
    pLVar3 = internal::LogMessage::operator<<(&LStack_78,"Messages can\'t have default values!");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
    internal::LogMessage::~LogMessage(&LStack_78);
  default:
    internal::LogMessage::LogMessage
              (&LStack_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
               ,0x752);
    pLVar3 = internal::LogMessage::operator<<
                       (&LStack_78,"Can\'t get here: failed to get default value as string");
    internal::LogFinisher::operator=((LogFinisher *)&local_40,pLVar3);
    internal::LogMessage::~LogMessage(&LStack_78);
    pcVar5 = "";
LAB_002dddd3:
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&LStack_78);
  }
  return __return_storage_ptr__;
}

Assistant:

string FieldDescriptor::DefaultValueAsString(bool quote_string_type) const {
  GOOGLE_CHECK(has_default_value()) << "No default value";
  switch (cpp_type()) {
    case CPPTYPE_INT32:
      return SimpleItoa(default_value_int32());
      break;
    case CPPTYPE_INT64:
      return SimpleItoa(default_value_int64());
      break;
    case CPPTYPE_UINT32:
      return SimpleItoa(default_value_uint32());
      break;
    case CPPTYPE_UINT64:
      return SimpleItoa(default_value_uint64());
      break;
    case CPPTYPE_FLOAT:
      return SimpleFtoa(default_value_float());
      break;
    case CPPTYPE_DOUBLE:
      return SimpleDtoa(default_value_double());
      break;
    case CPPTYPE_BOOL:
      return default_value_bool() ? "true" : "false";
      break;
    case CPPTYPE_STRING:
      if (quote_string_type) {
        return "\"" + CEscape(default_value_string()) + "\"";
      } else {
        if (type() == TYPE_BYTES) {
          return CEscape(default_value_string());
        } else {
          return default_value_string();
        }
      }
      break;
    case CPPTYPE_ENUM:
      return default_value_enum()->name();
      break;
    case CPPTYPE_MESSAGE:
      GOOGLE_LOG(DFATAL) << "Messages can't have default values!";
      break;
  }
  GOOGLE_LOG(FATAL) << "Can't get here: failed to get default value as string";
  return "";
}